

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalGenerator::CheckCMP0037(cmGlobalGenerator *this,string *targetName,string *reason)

{
  cmake *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  cmTarget *this_01;
  ostream *poVar3;
  cmListFileBacktrace *backtrace;
  PolicyID id;
  bool bVar4;
  MessageType t;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  this_01 = FindTarget(this,targetName,false);
  if (this_01 == (cmTarget *)0x0) {
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  PVar2 = cmTarget::GetPolicyStatus(this_01,CMP0037);
  if (PVar2 - NEW < 3) {
    t = FATAL_ERROR;
    bVar1 = true;
    bVar4 = false;
LAB_003199f9:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The target name \"",0x11);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(targetName->_M_dataplus)._M_p,
                        targetName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" is reserved ",0xe);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(reason->_M_dataplus)._M_p,reason->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"  It may result in undefined behavior.",0x26);
    }
    this_00 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    backtrace = cmTarget::GetBacktrace(this_01);
    cmake::IssueMessage(this_00,t,&local_1c8,backtrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) {
      bVar4 = false;
      goto LAB_00319acc;
    }
  }
  else if (PVar2 == WARN) {
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x25,id);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    bVar1 = false;
    bVar4 = true;
    t = AUTHOR_WARNING;
    goto LAB_003199f9;
  }
  bVar4 = true;
LAB_00319acc:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return bVar4;
}

Assistant:

bool cmGlobalGenerator::CheckCMP0037(std::string const& targetName,
                                     std::string const& reason) const
{
  cmTarget* tgt = this->FindTarget(targetName);
  if (!tgt) {
    return true;
  }
  MessageType messageType = MessageType::AUTHOR_WARNING;
  std::ostringstream e;
  bool issueMessage = false;
  switch (tgt->GetPolicyStatusCMP0037()) {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
      issueMessage = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      issueMessage = true;
      messageType = MessageType::FATAL_ERROR;
      break;
  }
  if (issueMessage) {
    e << "The target name \"" << targetName << "\" is reserved " << reason
      << ".";
    if (messageType == MessageType::AUTHOR_WARNING) {
      e << "  It may result in undefined behavior.";
    }
    this->GetCMakeInstance()->IssueMessage(messageType, e.str(),
                                           tgt->GetBacktrace());
    if (messageType == MessageType::FATAL_ERROR) {
      return false;
    }
  }
  return true;
}